

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O1

bool __thiscall
Minisat::Solver::implies(Solver *this,vec<Minisat::Lit,_int> *assumps,vec<Minisat::Lit,_int> *out)

{
  byte bVar1;
  Lit p;
  int iVar2;
  bool bVar3;
  CRef CVar4;
  byte bVar5;
  byte bVar6;
  long lVar7;
  long lVar8;
  bool bVar9;
  int local_34;
  
  vec<int,_int>::push(&this->trail_lim,&local_34);
  bVar3 = 0 < assumps->sz;
  if (0 < assumps->sz) {
    lVar7 = 0;
    do {
      p.x = assumps->data[lVar7].x;
      if ((this->assigns).super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>.map.sz <=
          p.x >> 1) {
        __assert_fail("has(k)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/mtl/IntMap.h"
                      ,0x27,
                      "const V &Minisat::IntMap<int, Minisat::lbool>::operator[](K) const [K = int, V = Minisat::lbool, MkIndex = Minisat::MkIndexDefault<int>]"
                     );
      }
      bVar1 = (this->assigns).super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>.map.
              data[p.x >> 1].value;
      bVar5 = (byte)p.x & 1 ^ bVar1;
      bVar6 = l_False & 2;
      bVar9 = bVar5 == l_False;
      if (bVar9 && bVar6 == 0 || (bVar6 & bVar1) != 0) {
        cancelUntil(this,0);
      }
      else if (bVar5 == l_Undef && (l_Undef & 2) == 0 || (l_Undef & 2 & bVar1) != 0) {
        uncheckedEnqueue(this,p,0xffffffff);
      }
      if (bVar9 && bVar6 == 0 || (bVar6 & bVar1) != 0) {
        if (bVar3) {
          return false;
        }
        break;
      }
      lVar7 = lVar7 + 1;
      bVar3 = lVar7 < assumps->sz;
    } while (lVar7 < assumps->sz);
  }
  iVar2 = (this->trail).sz;
  lVar7 = (long)iVar2;
  CVar4 = propagate(this);
  if (CVar4 == 0xffffffff) {
    if (out->data != (Lit *)0x0) {
      out->sz = 0;
    }
    if (iVar2 < (this->trail).sz) {
      lVar8 = lVar7 * 4;
      do {
        vec<Minisat::Lit,_int>::push(out,(Lit *)((long)&((this->trail).data)->x + lVar8));
        lVar7 = lVar7 + 1;
        lVar8 = lVar8 + 4;
      } while (lVar7 < (this->trail).sz);
    }
  }
  cancelUntil(this,0);
  return CVar4 == 0xffffffff;
}

Assistant:

bool Solver::implies(const vec<Lit>& assumps, vec<Lit>& out)
{
    trail_lim.push(trail.size());
    for (int i = 0; i < assumps.size(); i++){
        Lit a = assumps[i];

        if (value(a) == l_False){
            cancelUntil(0);
            return false;
        }else if (value(a) == l_Undef)
            uncheckedEnqueue(a);
    }

    unsigned trail_before = trail.size();
    bool     ret          = true;
    if (propagate() == CRef_Undef){
        out.clear();
        for (int j = trail_before; j < trail.size(); j++)
            out.push(trail[j]);
    }else
        ret = false;
    
    cancelUntil(0);
    return ret;
}